

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PortConnection * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>&,slang::ast::Expression_const*&>
          (BumpAllocator *this,InterfacePortSymbol *args,
          pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *args_1,
          Expression **args_2)

{
  Expression *pEVar1;
  PortConnection *pPVar2;
  
  pPVar2 = (PortConnection *)allocate(this,0x38,8);
  pEVar1 = *args_2;
  pPVar2->port = &args->super_Symbol;
  pPVar2->connectedSymbol = args_1->first;
  pPVar2->expr = pEVar1;
  pPVar2->modport = args_1->second;
  (pPVar2->field_4).exprSyntax = (ExpressionSyntax *)0x0;
  pPVar2->useDefault = false;
  pPVar2->isImplicit = false;
  return pPVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }